

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value(robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *this,size_t ibucket,distance_type dist_from_ideal_bucket,truncated_hash_type hash,
              value_type *value)

{
  uint uVar1;
  truncated_hash_type tVar2;
  pointer pbVar3;
  short sVar4;
  distance_type *pdVar5;
  pointer pbVar6;
  short __tmp;
  short sVar7;
  distance_type dVar8;
  ulong uVar9;
  truncated_hash_type local_34;
  
  pbVar6 = (this->m_buckets).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start + ibucket;
  std::__cxx11::wstring::swap((wstring *)value);
  uVar1 = value->second;
  value->second = *(uint *)((long)&pbVar6->m_value + 0x20);
  *(uint *)((long)&pbVar6->m_value + 0x20) = uVar1;
  sVar7 = pbVar6->m_dist_from_ideal_bucket;
  pbVar6->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
  local_34 = (pbVar6->super_bucket_entry_hash<true>).m_hash;
  (pbVar6->super_bucket_entry_hash<true>).m_hash = hash;
  uVar9 = ibucket + 1 & (this->super_power_of_two_growth_policy<2UL>).m_mask;
  sVar7 = sVar7 + 1;
  pbVar3 = (this->m_buckets).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = pbVar3 + uVar9;
  sVar4 = pbVar3[uVar9].m_dist_from_ideal_bucket;
  if (sVar4 != -1) {
    pdVar5 = &pbVar3[uVar9].m_dist_from_ideal_bucket;
    do {
      dVar8 = sVar7;
      if (sVar4 < sVar7) {
        if ((0x7f < sVar7) && (0.15 <= (float)this->m_nb_elements / (float)this->m_bucket_count)) {
          this->m_grow_on_next_insert = true;
        }
        std::__cxx11::wstring::swap((wstring *)value);
        uVar1 = value->second;
        value->second = *(uint *)((long)&pbVar6->m_value + 0x20);
        *(uint *)((long)&pbVar6->m_value + 0x20) = uVar1;
        dVar8 = *pdVar5;
        *pdVar5 = sVar7;
        tVar2 = (pbVar6->super_bucket_entry_hash<true>).m_hash;
        (pbVar6->super_bucket_entry_hash<true>).m_hash = local_34;
        local_34 = tVar2;
      }
      uVar9 = uVar9 + 1 & (this->super_power_of_two_growth_policy<2UL>).m_mask;
      sVar7 = dVar8 + 1;
      pbVar3 = (this->m_buckets).
               super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = pbVar3 + uVar9;
      pdVar5 = &pbVar3[uVar9].m_dist_from_ideal_bucket;
      sVar4 = *pdVar5;
    } while (sVar4 != -1);
  }
  std::__cxx11::wstring::wstring((wstring *)&(pbVar6->m_value).__align,(wstring *)value);
  *(uint *)((long)&pbVar6->m_value + 0x20) = value->second;
  (pbVar6->super_bucket_entry_hash<true>).m_hash = local_34;
  pbVar6->m_dist_from_ideal_bucket = sVar7;
  return;
}

Assistant:

void insert_value(std::size_t ibucket, distance_type dist_from_ideal_bucket, 
                      truncated_hash_type hash, value_type&& value) 
    {
        m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket, hash, value);
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
        
        while(!m_buckets[ibucket].empty()) {
            if(dist_from_ideal_bucket > m_buckets[ibucket].dist_from_ideal_bucket()) {
                if(dist_from_ideal_bucket >= REHASH_ON_HIGH_NB_PROBES__NPROBES && 
                   load_factor() >= REHASH_ON_HIGH_NB_PROBES__MIN_LOAD_FACTOR) 
                {
                    /**
                     * The number of probes is really high, rehash the map on the next insert.
                     * Difficult to do now as rehash may throw.
                     */
                    m_grow_on_next_insert = true;
                }
            
                m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket, hash, value);
            }
            
            ibucket = next_bucket(ibucket);
            dist_from_ideal_bucket++;
        }
        
        m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket, hash, std::move(value));
    }